

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterhammer.cpp
# Opt level: O2

int AF_A_FHammerThrow(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  long *plVar2;
  AWeapon *this_00;
  bool bVar3;
  PClassActor *type;
  AActor *pAVar4;
  char *__assertion;
  DObject *this_01;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005393fc;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005393ec;
  this_01 = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_01 == (DObject *)0x0) goto LAB_00539309;
    bVar3 = DObject::IsKindOf(this_01,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005393fc;
    }
  }
  else {
    if (this_01 != (DObject *)0x0) goto LAB_005393ec;
LAB_00539309:
    this_01 = (DObject *)0x0;
  }
  if (numparam == 1) goto LAB_00539386;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_005393ec:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005393fc;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar3)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005393fc;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_005393ec;
  }
  if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00539386:
    plVar2 = *(long **)&this_01[0xc].ObjectFlags;
    if ((plVar2 != (long *)0x0) && (pAVar4 = (AActor *)*plVar2, pAVar4->weaponspecial != 0)) {
      this_00 = (AWeapon *)plVar2[0x1a];
      if (this_00 != (AWeapon *)0x0) {
        bVar3 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,false,-1);
        if (!bVar3) {
          return 0;
        }
        pAVar4 = (AActor *)*plVar2;
      }
      type = PClass::FindActor("HammerMissile");
      pAVar4 = P_SpawnPlayerMissile(pAVar4,type);
      if (pAVar4 != (AActor *)0x0) {
        pAVar4->special1 = 0;
      }
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005393fc:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterhammer.cpp"
                ,0x62,"int AF_A_FHammerThrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FHammerThrow)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}

	if (!player->mo->weaponspecial)
	{
		return 0;
	}
	AWeapon *weapon = player->ReadyWeapon;
	if (weapon != NULL)
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire, false))
			return 0;
	}
	mo = P_SpawnPlayerMissile (player->mo, PClass::FindActor("HammerMissile")); 
	if (mo)
	{
		mo->special1 = 0;
	}
	return 0;
}